

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O2

void xrep0_pipe_fini(void *arg)

{
  nni_aio_fini((nni_aio *)((long)arg + 0x18));
  nni_aio_fini((nni_aio *)((long)arg + 0x1e0));
  nni_aio_fini((nni_aio *)((long)arg + 0x3a8));
  nni_aio_fini((nni_aio *)((long)arg + 0x570));
  nni_msgq_fini(*(nni_msgq **)((long)arg + 0x10));
  return;
}

Assistant:

static void
xrep0_pipe_fini(void *arg)
{
	xrep0_pipe *p = arg;

	nni_aio_fini(&p->aio_getq);
	nni_aio_fini(&p->aio_send);
	nni_aio_fini(&p->aio_recv);
	nni_aio_fini(&p->aio_putq);
	nni_msgq_fini(p->sendq);
}